

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O2

void ZSTD_fillHashTable(ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,void *end,
                       ZSTD_dictTableLoadMethod_e dtlm)

{
  U32 hBits;
  U32 mls;
  U32 *pUVar1;
  size_t sVar2;
  U32 i;
  long lVar3;
  BYTE *pBVar4;
  ulong local_48;
  
  pUVar1 = ms->hashTable;
  hBits = cParams->hashLog;
  mls = cParams->searchLength;
  local_48 = (ulong)ms->nextToUpdate;
  pBVar4 = (ms->window).base + local_48;
  do {
    if ((BYTE *)((long)end - 8U) < pBVar4 + 2) {
      return;
    }
    lVar3 = 0;
    do {
      if (lVar3 == 3) break;
      sVar2 = ZSTD_hashPtr(pBVar4 + lVar3,hBits,mls);
      if ((lVar3 == 0) || (pUVar1[sVar2] == 0)) {
        pUVar1[sVar2] = (int)local_48 + (int)lVar3;
      }
      lVar3 = lVar3 + 1;
    } while (dtlm != ZSTD_dtlm_fast);
    local_48 = local_48 + 3;
    pBVar4 = pBVar4 + 3;
  } while( true );
}

Assistant:

void ZSTD_fillHashTable(ZSTD_matchState_t* ms,
                        ZSTD_compressionParameters const* cParams,
                        void const* end, ZSTD_dictTableLoadMethod_e dtlm)
{
    U32* const hashTable = ms->hashTable;
    U32  const hBits = cParams->hashLog;
    U32  const mls = cParams->searchLength;
    const BYTE* const base = ms->window.base;
    const BYTE* ip = base + ms->nextToUpdate;
    const BYTE* const iend = ((const BYTE*)end) - HASH_READ_SIZE;
    const U32 fastHashFillStep = 3;

    /* Always insert every fastHashFillStep position into the hash table.
     * Insert the other positions if their hash entry is empty.
     */
    for (; ip + fastHashFillStep - 1 <= iend; ip += fastHashFillStep) {
        U32 const current = (U32)(ip - base);
        U32 i;
        for (i = 0; i < fastHashFillStep; ++i) {
            size_t const hash = ZSTD_hashPtr(ip + i, hBits, mls);
            if (i == 0 || hashTable[hash] == 0)
                hashTable[hash] = current + i;
            /* Only load extra positions for ZSTD_dtlm_full */
            if (dtlm == ZSTD_dtlm_fast)
                break;
        }
    }
}